

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-decompress.c
# Opt level: O1

cc_bool PopDescriptor(KosinskiDecompressCallbacks *callbacks)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = descriptor;
  descriptor = descriptor >> 1;
  descriptor_bits_remaining = descriptor_bits_remaining - 1;
  if (descriptor_bits_remaining == 0) {
    read_position = read_position + 1;
    uVar2 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    read_position = read_position + 1;
    uVar3 = (*callbacks->read_byte)(callbacks->read_byte_user_data);
    descriptor = uVar3 << 8 | uVar2;
    descriptor_bits_remaining = 0x10;
  }
  return (byte)uVar1 & 1;
}

Assistant:

static cc_bool PopDescriptor(const KosinskiDecompressCallbacks* const callbacks)
{
	const cc_bool result = (descriptor & 1) != 0;

	descriptor >>= 1;

	if (--descriptor_bits_remaining == 0)
		GetDescriptor(callbacks);

	return result;
}